

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall google::protobuf::internal::ExtensionSet::ByteSize(ExtensionSet *this)

{
  size_t sVar1;
  KeyValue *pKVar2;
  size_t sVar3;
  KeyValue *pKVar4;
  size_t local_20;
  
  local_20 = 0;
  pKVar2 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    if (this->flat_size_ == 0) {
      sVar3 = 0;
    }
    else {
      pKVar4 = pKVar2 + this->flat_size_;
      sVar3 = 0;
      do {
        sVar1 = Extension::ByteSize(&pKVar2->second,pKVar2->first);
        sVar3 = sVar3 + sVar1;
        pKVar2 = pKVar2 + 1;
      } while (pKVar2 != pKVar4);
    }
  }
  else {
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::ByteSize()const::__0>
              ((_Base_ptr)(pKVar2->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar2->second,(anon_class_8_1_736c71da)&local_20);
    sVar3 = local_20;
  }
  return sVar3;
}

Assistant:

size_t ExtensionSet::ByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.ByteSize(number);
  });
  return total_size;
}